

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilerOutputter.cpp
# Opt level: O1

void __thiscall CppUnit::CompilerOutputter::printStatistics(CompilerOutputter *this)

{
  int iVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(this->m_stream,"Failures !!!\n",0xd);
  poVar2 = this->m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Run: ",5);
  iVar1 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xb])
                    ();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Failure total: ",0xf);
  iVar1 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xe])
                    ();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Failures: ",10);
  iVar1 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xd])
                    ();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Errors: ",8);
  iVar1 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xc])
                    ();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  return;
}

Assistant:

void 
CompilerOutputter::printStatistics()
{
  m_stream  <<  "Failures !!!\n";
  m_stream  <<  "Run: "  <<  m_result->runTests()  << "   "
            <<  "Failure total: "  <<  m_result->testFailuresTotal()  << "   "
            <<  "Failures: "  <<  m_result->testFailures()  << "   "
            <<  "Errors: "  <<  m_result->testErrors()
            <<  "\n";
}